

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventQueue.cpp
# Opt level: O0

void __thiscall Liby::EventQueue::~EventQueue(EventQueue *this)

{
  EventQueue *this_local;
  
  std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->eventChanelPtr_);
  BlockingQueue<std::function<void_()>_>::~BlockingQueue(&this->eventHandlers_);
  std::unique_ptr<Liby::Channel,_std::default_delete<Liby::Channel>_>::~unique_ptr
            (&this->eventChanelPtr_);
  std::unique_ptr<Liby::FileDescriptor,_std::default_delete<Liby::FileDescriptor>_>::~unique_ptr
            (&this->eventfp_);
  return;
}

Assistant:

EventQueue::~EventQueue() {
    //　使eventChanelPtr_析构时不去调用Poller基类的虚函数
    if (eventChanelPtr_) {
        //        eventChanelPtr_->setPoller(nullptr);
    }
}